

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

OneofDescriptorProto * __thiscall
google::protobuf::DescriptorProto::add_oneof_decl(DescriptorProto *this)

{
  int iVar1;
  Rep *pRVar2;
  OneofDescriptorProto *pOVar3;
  
  pRVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      return (OneofDescriptorProto *)pRVar2->elements[iVar1];
    }
  }
  pOVar3 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                     ((this->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
  pOVar3 = (OneofDescriptorProto *)
           internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(this->oneof_decl_).super_RepeatedPtrFieldBase,pOVar3);
  return pOVar3;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::OneofDescriptorProto* DescriptorProto::add_oneof_decl() {
  ::PROTOBUF_NAMESPACE_ID::OneofDescriptorProto* _add = _internal_add_oneof_decl();
  // @@protoc_insertion_point(field_add:google.protobuf.DescriptorProto.oneof_decl)
  return _add;
}